

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeachCli.hpp
# Opt level: O1

void __thiscall peach::cli::PeachCli::executeProgram(PeachCli *this,ifstream *ifs,ostream *os)

{
  int iVar1;
  long *plVar2;
  ExprShPtr EVar3;
  string programText;
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  tokens;
  undefined1 local_68 [16];
  string local_58;
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)(local_68 + 0x10),
             *(undefined8 *)(ifs + *(long *)(*(long *)ifs + -0x18) + 0xe8),0xffffffff,0,0xffffffff);
  fsm::FsmCollection::tokenizeText
            (&local_38,&this->tokenizator_,(string *)(local_68 + 0x10),&this->keywords_);
  interpreter::Interpreter::interpretateLines
            (&this->interpreter_,
             (TokenIterator)
             local_38.
             super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (TokenIterator)
             local_38.
             super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  EVar3 = interpreter::Interpreter::getInterpretationResult((Interpreter *)local_68);
  iVar1 = (*(code *)**(undefined8 **)local_68._0_8_)
                    (local_68._0_8_,&this->scope_,
                     EVar3.
                     super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
  plVar2 = (long *)std::ostream::operator<<((ostream *)os,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  std::
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  ::~vector(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void executeProgram(std::ifstream &ifs, std::ostream &os)
    {
        std::string programText((std::istreambuf_iterator<char>(ifs)),
                                std::istreambuf_iterator<char>());
        auto tokens = tokenizator_.tokenizeText(programText, keywords_);
        try
        {
            interpreter_.interpretateLines(tokens.begin(), tokens.end());
            os << interpreter_.getInterpretationResult()->eval(scope_) << std::endl;
        }
        catch (const std::exception &e)
        {
            os << e.what() << '\n';
        }
    }